

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
::AssertNotDebugCapacity
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
           *this)

{
  ulong uVar1;
  
  uVar1 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (uVar1 != 0) {
    if (0xffffffffffffff9a < uVar1) {
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
      ::AssertNotDebugCapacity();
    }
    return;
  }
  __assert_fail("cap >= kDefaultCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb75,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
               );
}

Assistant:

void AssertNotDebugCapacity() const {
    if (ABSL_PREDICT_TRUE(capacity() <
                          InvalidCapacity::kAboveMaxValidCapacity)) {
      return;
    }
    assert(capacity() != InvalidCapacity::kReentrance &&
           "Reentrant container access during element construction/destruction "
           "is not allowed.");
    assert(capacity() != InvalidCapacity::kDestroyed &&
           "Use of destroyed hash table.");
    if (SwisstableGenerationsEnabled() &&
        ABSL_PREDICT_FALSE(capacity() >= InvalidCapacity::kMovedFrom)) {
      if (capacity() == InvalidCapacity::kSelfMovedFrom) {
        // If this log triggers, then a hash table was move-assigned to itself
        // and then used again later without being reinitialized.
        ABSL_RAW_LOG(FATAL, "Use of self-move-assigned hash table.");
      }
      ABSL_RAW_LOG(FATAL, "Use of moved-from hash table.");
    }
  }